

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.hpp
# Opt level: O1

void __thiscall
pstore::repo::linked_definitions::
linked_definitions<pstore::repo::linked_definitions::value_type_const*,void>
          (linked_definitions *this,value_type *begin,value_type *end)

{
  uint64_t uVar1;
  
  uVar1 = (long)end - (long)begin >> 5;
  if (-1 < (long)uVar1) {
    this->size_ = uVar1;
    this->unused_ = 0;
    *(undefined8 *)&this->definitions_[0].compilation.v_ = 0;
    *(undefined8 *)((long)&this->definitions_[0].compilation.v_ + 8) = 0;
    this->definitions_[0].index = 0;
    this->definitions_[0].unused = 0;
    this->definitions_[0].pointer.a_.a_ = 0;
    if (end != begin) {
      memmove(this->definitions_,begin,(long)end - (long)begin);
    }
    this->unused_ = 0;
    return;
  }
  assert_failed("d >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/linked_definitions_section.hpp"
                ,0x28);
}

Assistant:

linked_definitions::linked_definitions (Iterator begin, Iterator end)
                : size_{details::udistance (begin, end)} {
            std::copy (begin, end, &definitions_[0]);

            unused_ = 0; // to suppress a warning about the field being unused.
            PSTORE_STATIC_ASSERT (std::is_standard_layout<linked_definitions>::value);
            PSTORE_STATIC_ASSERT (alignof (linked_definitions) == 16);
            PSTORE_STATIC_ASSERT (offsetof (linked_definitions, size_) == 0);
            PSTORE_STATIC_ASSERT (offsetof (linked_definitions, unused_) == 8);
            PSTORE_STATIC_ASSERT (offsetof (linked_definitions, definitions_) == 16);
        }